

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 17-syntax-catch.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  allocator_type local_61;
  texts local_60;
  vector<lest::test,_std::allocator<lest::test>_> local_48;
  vector<lest::test,_std::allocator<lest::test>_> local_30;
  
  std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_30,&specification);
  std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_48,&local_30);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_60,argv + 1
             ,argv + argc,&local_61);
  iVar1 = lest::run(&local_48,&local_60,(ostream *)&std::cout);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_48);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_30);
  return iVar1;
}

Assistant:

int main( int argc, char * argv[] )
{
    return lest::run( specification, argc, argv /*, std::cout */ );
}